

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

void PIT_FloorDrop(AActor *thing,FChangePosition *cpos)

{
  double oldz;
  double dVar1;
  double dVar2;
  uint uVar3;
  player_t *ppVar4;
  double dVar5;
  
  oldz = (thing->__Pos).Z;
  dVar1 = thing->floorz;
  P_AdjustFloorCeil(thing,cpos);
  dVar5 = thing->floorz;
  if ((dVar1 == dVar5) && (!NAN(dVar1) && !NAN(dVar5))) {
    return;
  }
  if (((thing->flags4).Value & 0x80) != 0) {
    return;
  }
  dVar2 = (thing->Vel).Z;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
LAB_00517552:
    dVar2 = (thing->__Pos).Z;
    if (((dVar2 == dVar1) && (!NAN(dVar2) && !NAN(dVar1))) ||
       ((((thing->flags).Value & 0x20000200) != 0x200 || (-1 < (int)(thing->flags6).Value))))
    goto LAB_0051759f;
    dVar5 = (dVar5 - dVar1) + dVar2;
  }
  else {
    uVar3 = (thing->flags).Value;
    if ((uVar3 >> 9 & 1) == 0) {
LAB_005174fb:
      if ((-1 < (int)(thing->flags5).Value) &&
         ((((cpos->sector->Flags & 4) == 0 && (9.0 < cpos->moveamt || cpos->moveamt == 9.0)) ||
          (cpos->moveamt < (thing->__Pos).Z - dVar5)))) goto LAB_0051759f;
    }
    else {
      if ((((uVar3 >> 0x1d & 1) != 0) || (dVar2 = (thing->__Pos).Z, dVar2 != dVar1)) ||
         (NAN(dVar2) || NAN(dVar1))) goto LAB_00517552;
      if ((uVar3 >> 9 & 1) == 0) goto LAB_005174fb;
    }
  }
  (thing->__Pos).Z = dVar5;
  P_CheckFakeFloorTriggers(thing,oldz,false);
  AActor::UpdateRenderSectorList(thing);
LAB_0051759f:
  ppVar4 = thing->player;
  if ((ppVar4 != (player_t *)0x0) && (ppVar4->mo == (APlayerPawn *)thing)) {
    ppVar4->viewz = ((thing->__Pos).Z - oldz) + ppVar4->viewz;
  }
  return;
}

Assistant:

void PIT_FloorDrop(AActor *thing, FChangePosition *cpos)
{
	double oldfloorz = thing->floorz;
	double oldz = thing->Z();

	P_AdjustFloorCeil(thing, cpos);

	if (oldfloorz == thing->floorz) return;
	if (thing->flags4 & MF4_ACTLIKEBRIDGE) return; // do not move bridge things

	if (thing->Vel.Z == 0 &&
		(!(thing->flags & MF_NOGRAVITY) ||
		(thing->Z() == oldfloorz && !(thing->flags & MF_NOLIFTDROP))))
	{
		if ((thing->flags & MF_NOGRAVITY) || (thing->flags5 & MF5_MOVEWITHSECTOR) ||
			(((cpos->sector->Flags & SECF_FLOORDROP) || cpos->moveamt < 9)
			&& thing->Z() - thing->floorz <= cpos->moveamt))
		{
			thing->SetZ(thing->floorz);
			P_CheckFakeFloorTriggers(thing, oldz);
			thing->UpdateRenderSectorList();
		}
	}
	else if ((thing->Z() != oldfloorz && !(thing->flags & MF_NOLIFTDROP)))
	{
		if ((thing->flags & MF_NOGRAVITY) && (thing->flags6 & MF6_RELATIVETOFLOOR))
		{
			thing->AddZ(-oldfloorz + thing->floorz);
			P_CheckFakeFloorTriggers(thing, oldz);
			thing->UpdateRenderSectorList();
		}
	}
	if (thing->player && thing->player->mo == thing)
	{
		thing->player->viewz += thing->Z() - oldz;
	}
}